

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::QuadO1::SubGeometry(QuadO1 *this,dim_t codim,dim_t i)

{
  sub_idx_t sVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *this_00;
  runtime_error *this_01;
  uint in_ECX;
  undefined4 in_register_00000034;
  long *plVar2;
  string local_a80;
  allocator<char> local_a59;
  string local_a58;
  allocator<char> local_a31;
  string local_a30;
  stringstream local_a10 [8];
  stringstream ss_3;
  ostream local_a00 [376];
  ConstColXpr local_888;
  undefined1 local_850 [16];
  string local_840;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  string local_7d0;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  stringstream local_760 [8];
  stringstream ss_2;
  ostream local_750 [383];
  RefEl local_5d1;
  ConstColXpr local_5d0;
  RefEl local_591;
  ConstColXpr local_590;
  int local_558;
  uint local_554;
  Matrix<double,__1,_2,_0,__1,_2> local_550;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_540;
  undefined1 local_520 [16];
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  stringstream local_430 [8];
  stringstream ss_1;
  ostream local_420 [376];
  undefined1 local_2a8 [16];
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  uint local_20;
  dim_t local_1c;
  dim_t i_local;
  dim_t codim_local;
  QuadO1 *this_local;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,codim);
  local_1c = i;
  _i_local = plVar2;
  this_local = this;
  if (i == 0) {
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::operator<<(local_198,"i is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"i == 0",&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_201);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1d8,&local_200,0xa3,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"false",&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_271);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"",(allocator<char> *)(local_2a8 + 0xf));
      lf::base::AssertionFailed(&local_248,&local_270,0xa3,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator((allocator<char> *)(local_2a8 + 0xf));
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      abort();
    }
    std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,4,0,_1,4>const&>
              ((Matrix<double,__1,_4,_0,__1,_4> *)local_2a8);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::QuadO1,std::default_delete<lf::geometry::QuadO1>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
                    local_2a8);
    std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::~unique_ptr
              ((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
               local_2a8);
  }
  else if (i == 1) {
    if (3 < in_ECX) {
      std::__cxx11::stringstream::stringstream(local_430);
      std::operator<<(local_420,"i is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"i >= 0 && i < 4",&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_479);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_450,&local_478,0xa6,&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"false",&local_4c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_4e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_510,"",(allocator<char> *)(local_520 + 0xf));
      lf::base::AssertionFailed(&local_4c0,&local_4e8,0xa6,&local_510);
      std::__cxx11::string::~string((string *)&local_510);
      std::allocator<char>::~allocator((allocator<char> *)(local_520 + 0xf));
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      abort();
    }
    local_20 = in_ECX;
    local_554 = (**(code **)(*plVar2 + 8))();
    local_558 = 2;
    Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<unsigned_int,int>
              ((Matrix<double,_1,2,0,_1,2> *)&local_550,&local_554,&local_558);
    local_591.type_ = (**(code **)(*plVar2 + 0x10))();
    sVar1 = lf::base::RefEl::SubSubEntity2SubEntity(&local_591,1,local_20,1,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_590,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)(plVar2 + 1),
               (ulong)sVar1);
    Eigen::DenseBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator<<
              (&local_540,(DenseBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_550,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                *)&local_590);
    local_5d1.type_ = (**(code **)(*plVar2 + 0x10))();
    sVar1 = lf::base::RefEl::SubSubEntity2SubEntity(&local_5d1,1,local_20,1,1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_5d0,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)(plVar2 + 1),
               (ulong)sVar1);
    this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_540,
                         (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                          *)&local_5d0);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(this_00);
    std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,2,0,_1,2>&>
              ((Matrix<double,__1,_2,_0,__1,_2> *)local_520);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                     *)local_520);
    std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
    ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                 *)local_520);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer(&local_540);
    Eigen::Matrix<double,_-1,_2,_0,_-1,_2>::~Matrix(&local_550);
  }
  else {
    if (i != 2) {
      std::__cxx11::stringstream::stringstream(local_a10);
      std::operator<<(local_a00,"codim is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"false",&local_a31);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a58,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_a59);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_a30,&local_a58,0xb0,&local_a80);
      std::__cxx11::string::~string((string *)&local_a80);
      std::__cxx11::string::~string((string *)&local_a58);
      std::allocator<char>::~allocator(&local_a59);
      std::__cxx11::string::~string((string *)&local_a30);
      std::allocator<char>::~allocator(&local_a31);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"this code should not be reached");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (3 < in_ECX) {
      std::__cxx11::stringstream::stringstream(local_760);
      std::operator<<(local_750,"i is out of bounds.");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_780,"i >= 0 && i < 4",&local_781);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_7a9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_780,&local_7a8,0xad,&local_7d0);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::allocator<char>::~allocator(&local_7a9);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"false",&local_7f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_818,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_819);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_840,"",(allocator<char> *)(local_850 + 0xf));
      lf::base::AssertionFailed(&local_7f0,&local_818,0xad,&local_840);
      std::__cxx11::string::~string((string *)&local_840);
      std::allocator<char>::~allocator((allocator<char> *)(local_850 + 0xf));
      std::__cxx11::string::~string((string *)&local_818);
      std::allocator<char>::~allocator(&local_819);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::allocator<char>::~allocator(&local_7f1);
      abort();
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_4,_0,_-1,_4>_>::col
              (&local_888,(DenseBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_> *)(plVar2 + 1),
               (ulong)in_ECX);
    std::
    make_unique<lf::geometry::Point,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>
              ((Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true> *)local_850);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                    local_850);
    std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
              ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
               local_850);
  }
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> QuadO1::SubGeometry(dim_t codim, dim_t i) const {
  using std::make_unique;
  switch (codim) {
    case 0:
      LF_ASSERT_MSG(i == 0, "i is out of bounds.");
      return std::make_unique<QuadO1>(coords_);
    case 1:
      LF_ASSERT_MSG(i >= 0 && i < 4, "i is out of bounds.");
      return make_unique<SegmentO1>(
          (Eigen::Matrix<double, Eigen::Dynamic, 2>(DimGlobal(), 2)
               << coords_.col(RefEl().SubSubEntity2SubEntity(1, i, 1, 0)),
           coords_.col(RefEl().SubSubEntity2SubEntity(1, i, 1, 1)))
              .finished());
    case 2:
      LF_ASSERT_MSG(i >= 0 && i < 4, "i is out of bounds.");
      return make_unique<Point>(coords_.col(i));
    default:
      LF_VERIFY_MSG(false, "codim is out of bounds.");
  }
}